

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O0

int http_file_open(char *url,int rwmode,int *handle)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int local_a80;
  int iStack_a7c;
  char firstchar;
  int status;
  int flen;
  int ii;
  int contentlength;
  long len;
  char recbuf [1200];
  char errorstr [1200];
  char contenttype [100];
  char local_98 [8];
  char contentencoding [100];
  FILE *httpfile;
  int *handle_local;
  int rwmode_local;
  char *url_local;
  
  iVar1 = strncmp(netoutfile,"mem:",4);
  if (iVar1 == 0) {
    iVar1 = http_open(url,0,handle);
    return iVar1;
  }
  closehttpfile = 0;
  closefile = 0;
  closeoutfile = 0;
  sVar3 = strlen(netoutfile);
  iStack_a7c = (int)sVar3;
  if (iStack_a7c == 0) {
    ffpmsg("Output file not set, shouldn\'t have happened (http_file_open)");
    return 0x68;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)env);
  if (iVar1 == 0) {
    signal(0xe,signal_handler);
    alarm(net_timeout);
    local_a80 = http_open_network(url,(FILE **)(contentencoding + 0x60),local_98,errorstr + 0x4a8,
                                  &flen);
    if (local_a80 == 0) {
      closehttpfile = closehttpfile + 1;
      iVar1 = 0;
      if (netoutfile[0] == '!') {
        for (status = 0; status < iStack_a7c; status = status + 1) {
          netoutfile[status] = netoutfile[status + 1];
        }
        iVar1 = file_remove(netoutfile);
      }
      local_a80 = iVar1;
      iVar1 = fgetc(stack0xffffffffffffffd0);
      ungetc((int)(char)iVar1,stack0xffffffffffffffd0);
      iVar2 = strcmp(local_98,"x-gzip");
      if ((((((iVar2 == 0) || (iVar2 = strcmp(local_98,"x-compress"), iVar2 == 0)) ||
            (iVar2 = strcmp(errorstr + 0x4a8,"application/x-gzip"), iVar2 == 0)) ||
           ((iVar2 = strcmp(errorstr + 0x4a8,"application/gzip"), iVar2 == 0 ||
            (iVar2 = strcmp(errorstr + 0x4a8,"application/gzip-compressed"), iVar2 == 0)))) ||
          ((iVar2 = strcmp(errorstr + 0x4a8,"application/gzipped"), iVar2 == 0 ||
           ((iVar2 = strcmp(errorstr + 0x4a8,"application/x-compress"), iVar2 == 0 ||
            (iVar2 = strcmp(errorstr + 0x4a8,"application/x-compressed"), iVar2 == 0)))))) ||
         ((char)iVar1 == '\x1f')) {
        local_a80 = file_create(netoutfile,handle);
        if (local_a80 == 0) {
          file_close(*handle);
          outfile = (FILE *)fopen(netoutfile,"w");
          if ((FILE *)outfile == (FILE *)0x0) {
            ffpmsg("Unable to reopen the output file (http_file_open)");
            ffpmsg(netoutfile);
          }
          else {
            closeoutfile = closeoutfile + 1;
            local_a80 = 0;
            alarm(net_timeout * 10);
            local_a80 = uncompress2file(url,(FILE *)stack0xffffffffffffffd0,outfile,&local_a80);
            alarm(0);
            if (local_a80 == 0) {
              fclose((FILE *)outfile);
              closeoutfile = closeoutfile + -1;
              goto LAB_0013d341;
            }
            ffpmsg("Error uncompressing http file to disk file (http_file_open)");
            ffpmsg(url);
            ffpmsg(netoutfile);
          }
        }
        else {
          ffpmsg("Unable to create output file (http_file_open)");
          ffpmsg(netoutfile);
        }
      }
      else {
        local_a80 = file_create(netoutfile,handle);
        if (local_a80 == 0) {
          closefile = closefile + 1;
          if (flen % 0xb40 != 0) {
            snprintf(recbuf + 0x4a8,0x4b0,
                     "Content-Length not a multiple of 2880 (http_file_open) %d",(ulong)(uint)flen);
            ffpmsg(recbuf + 0x4a8);
          }
          alarm(net_timeout);
          while (_ii = fread(&len,1,0x4b0,stack0xffffffffffffffd0), _ii != 0) {
            alarm(0);
            local_a80 = file_write(*handle,&len,_ii);
            if (local_a80 != 0) {
              ffpmsg("Error copying http file to disk file (http_file_open)");
              ffpmsg(url);
              ffpmsg(netoutfile);
              goto LAB_0013d386;
            }
            local_a80 = 0;
          }
          file_close(*handle);
          closefile = closefile + -1;
LAB_0013d341:
          fclose(stack0xffffffffffffffd0);
          closehttpfile = closehttpfile + -1;
          signal(0xe,(__sighandler_t)0x0);
          alarm(0);
          iVar1 = file_open(netoutfile,rwmode,handle);
          return iVar1;
        }
        ffpmsg("Unable to create output file (http_file_open)");
        ffpmsg(netoutfile);
      }
    }
    else {
      alarm(0);
      ffpmsg("Unable to open http file (http_file_open)");
      ffpmsg(url);
    }
  }
  else {
    ffpmsg("Timeout (http_open)");
    snprintf(recbuf + 0x4a8,0x4b0,"Download timeout exceeded: %d seconds",(ulong)net_timeout);
    ffpmsg(recbuf + 0x4a8);
    ffpmsg("   (multiplied x10 for files requiring uncompression)");
    ffpmsg("   Timeout may be adjusted with fits_set_timeout");
  }
LAB_0013d386:
  alarm(0);
  if (closehttpfile != 0) {
    fclose(stack0xffffffffffffffd0);
  }
  if (closeoutfile != 0) {
    fclose((FILE *)outfile);
  }
  if (closefile != 0) {
    file_close(*handle);
  }
  signal(0xe,(__sighandler_t)0x0);
  return 0x68;
}

Assistant:

int http_file_open(char *url, int rwmode, int *handle)
{
  FILE *httpfile;
  char contentencoding[SHORTLEN], contenttype[SHORTLEN];
  char errorstr[MAXLEN];
  char recbuf[MAXLEN];
  long len;
  int contentlength;
  int ii, flen, status;
  char firstchar;

  /* Check if output file is actually a memory file */
  if (!strncmp(netoutfile, "mem:", 4) )
  {
     /* allow the memory file to be opened with write access */
     return( http_open(url, READONLY, handle) );
  }     

  closehttpfile = 0;
  closefile = 0;
  closeoutfile = 0;

  flen = strlen(netoutfile);
  if (!flen) {
      /* cfileio made a mistake, we need to know where to write the file */
      ffpmsg("Output file not set, shouldn't have happened (http_file_open)");
      return (FILE_NOT_OPENED);
  }

  /* do the signal handler bits */
  if (setjmp(env) != 0) {
    /* feels like the second time */
    /* this means something bad happened */
    ffpmsg("Timeout (http_open)");
    snprintf(errorstr, MAXLEN, "Download timeout exceeded: %d seconds",net_timeout);
    ffpmsg(errorstr);
    ffpmsg("   (multiplied x10 for files requiring uncompression)");
    ffpmsg("   Timeout may be adjusted with fits_set_timeout");
    goto error;
  }

  signal(SIGALRM, signal_handler);
  
  /* Open the network connection */
  alarm(net_timeout);
  if ((status = http_open_network(url,&httpfile, contentencoding,
				  contenttype, &contentlength))) {
    alarm(0);
    ffpmsg("Unable to open http file (http_file_open)");
    ffpmsg(url);
    goto error;
  }

  closehttpfile++;

  if (*netoutfile == '!')
  {
     /* user wants to clobber disk file, if it already exists */
     for (ii = 0; ii < flen; ii++)
         netoutfile[ii] = netoutfile[ii + 1];  /* remove '!' */

     status = file_remove(netoutfile);
  }

  firstchar = fgetc(httpfile);
  ungetc(firstchar,httpfile);
  if (!strcmp(contentencoding,"x-gzip") || 
      !strcmp(contentencoding,"x-compress") ||
      !strcmp(contenttype, "application/x-gzip") ||
      !strcmp(contenttype, "application/gzip") ||
      !strcmp(contenttype, "application/gzip-compressed") ||
      !strcmp(contenttype, "application/gzipped") ||
      !strcmp(contenttype, "application/x-compress") ||
      !strcmp(contenttype, "application/x-compressed") ||
      ('\037' == firstchar)) {

    /* to make this more cfitsioish we use the file driver calls to create
       the disk file */

    /* Create the output file */
    if ((status =  file_create(netoutfile,handle))) {
      ffpmsg("Unable to create output file (http_file_open)");
      ffpmsg(netoutfile);
      goto error;
    }

    file_close(*handle);
    if (NULL == (outfile = fopen(netoutfile,"w"))) {
      ffpmsg("Unable to reopen the output file (http_file_open)");
      ffpmsg(netoutfile);
      goto error;
    }
    closeoutfile++;
    status = 0;

    /* Ok, this is a tough case, let's be arbritary and say 10*net_timeout,
       Given the choices for nettimeout above they'll probaby ^C before, but
       it's always worth a shot*/

    alarm(net_timeout*10);
    status = uncompress2file(url,httpfile,outfile,&status);
    alarm(0);
    if (status) {
      ffpmsg("Error uncompressing http file to disk file (http_file_open)");
      ffpmsg(url);
      ffpmsg(netoutfile);
      goto error;
    }
    fclose(outfile);
    closeoutfile--;
  } else {
    
    /* Create the output file */
    if ((status =  file_create(netoutfile,handle))) {
      ffpmsg("Unable to create output file (http_file_open)");
      ffpmsg(netoutfile);
      goto error;
    }
    
    /* Give a warning message.  This could just be bad padding at the end
       so don't treat it like an error. */
    closefile++;
    
    if (contentlength % 2880) {
      snprintf(errorstr, MAXLEN,
	      "Content-Length not a multiple of 2880 (http_file_open) %d",
	      contentlength);
      ffpmsg(errorstr);
    }
    
    /* write a file */
    alarm(net_timeout);
    while(0 != (len = fread(recbuf,1,MAXLEN,httpfile))) {
      alarm(0);
      status = file_write(*handle,recbuf,len);
      if (status) {
	ffpmsg("Error copying http file to disk file (http_file_open)");
        ffpmsg(url);
        ffpmsg(netoutfile);
	goto error;
      }
    }
    file_close(*handle);
    closefile--;
  }
  
  fclose(httpfile);
  closehttpfile--;

  signal(SIGALRM, SIG_DFL);
  alarm(0);

  return file_open(netoutfile,rwmode,handle); 

 error:
  alarm(0); /* clear it */
  if (closehttpfile) {
    fclose(httpfile);
  }
  if (closeoutfile) {
    fclose(outfile);
  }
  if (closefile) {
    file_close(*handle);
  } 
  
  signal(SIGALRM, SIG_DFL);
  return (FILE_NOT_OPENED);
}